

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

float Scl_LibertyReadPinCap(Scl_Tree_t *p,Scl_Item_t *pPin,char *pName)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  Scl_Item_t *pSVar6;
  int iVar7;
  float fVar8;
  double dVar9;
  
  uVar1 = pPin->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    fVar8 = 0.0;
    if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
      pSVar6 = p->pItems + uVar1;
      pcVar5 = p->pContents;
      while( true ) {
        iVar3 = (pSVar6->Key).Beg;
        iVar7 = (pSVar6->Key).End - iVar3;
        iVar3 = strncmp(pcVar5 + iVar3,pName,(long)iVar7);
        if ((iVar3 == 0) && (sVar4 = strlen(pName), iVar7 == (int)sVar4)) break;
        uVar1 = pSVar6->Next;
        if (iVar2 <= (int)uVar1) goto LAB_004615ee;
        if ((int)uVar1 < 0) {
          return 0.0;
        }
        pSVar6 = p->pItems + uVar1;
        if (p->pItems == (Scl_Item_t *)0x0) {
          return 0.0;
        }
      }
      pcVar5 = Scl_LibertyReadString(p,pSVar6->Head);
      dVar9 = atof(pcVar5);
      fVar8 = (float)dVar9;
    }
    return fVar8;
  }
LAB_004615ee:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

float Scl_LibertyReadPinCap( Scl_Tree_t * p, Scl_Item_t * pPin, char * pName )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, pName )
        return atof(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}